

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::io::anon_unknown_0::IoTest::WriteString
          (IoTest *this,ZeroCopyOutputStream *output,string *str)

{
  uint uVar1;
  int iVar2;
  pointer *__ptr;
  _func_int **pp_Var3;
  char *message;
  char *in_R9;
  _func_int **__src;
  int out_size;
  void *out;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  AssertHelper local_80;
  int local_74;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  undefined1 local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  internal local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  AssertHelper local_38;
  
  __src = output->_vptr_ZeroCopyOutputStream;
  pp_Var3 = output[1]._vptr_ZeroCopyOutputStream;
  uVar1 = (*(this->super_Test)._vptr_Test[2])(this,&local_70,&local_74);
  if ((char)uVar1 != '\0') {
    do {
      local_80.data_._0_4_ = 0;
      testing::internal::CmpHelperGT<int,int>
                ((internal *)local_68,"out_size","0",&local_74,(int *)&local_80);
      if (local_68[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_80);
        message = anon_var_dwarf_a12c75 + 5;
        if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = (local_60->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                   ,0x93,message);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if ((long *)CONCAT44(local_80.data_._4_4_,local_80.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_80.data_._4_4_,local_80.data_._0_4_) + 8))();
        }
      }
      if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_60,local_60);
      }
      iVar2 = (int)pp_Var3;
      if (iVar2 <= local_74) {
        memcpy(local_70._M_head_impl,__src,(long)iVar2);
        (*(this->super_Test)._vptr_Test[3])(this,(ulong)(uint)(local_74 - iVar2));
        break;
      }
      memcpy(local_70._M_head_impl,__src,(long)local_74);
      __src = (_func_int **)((long)__src + (long)local_74);
      pp_Var3 = (_func_int **)(ulong)(uint)(iVar2 - local_74);
      uVar1 = (*(this->super_Test)._vptr_Test[2])(this,&local_70,&local_74);
    } while ((char)uVar1 != '\0');
  }
  local_48[0] = (internal)((byte)uVar1 & 1);
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((uVar1 & 1) == 0) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,local_48,
               (AssertionResult *)"WriteToOutput(output, str.c_str(), str.size())","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,199,(char *)CONCAT71(local_68._1_7_,local_68[0]));
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_68._1_7_,local_68[0]) != &local_58) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_68._1_7_,local_68[0]),local_58._M_allocated_capacity + 1);
    }
    if (local_70._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_70._M_head_impl + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  return;
}

Assistant:

void IoTest::WriteString(ZeroCopyOutputStream* output, const std::string& str) {
  EXPECT_TRUE(WriteToOutput(output, str.c_str(), str.size()));
}